

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  CMimeAddress_T *ca;
  char *s;
  char **argv_local;
  int argc_local;
  
  uVar2 = cmime_address_new();
  cmime_address_set_name(uVar2,addr_string1_name_part);
  cmime_address_set_email(uVar2,addr_string1_email_part);
  pcVar3 = (char *)cmime_address_to_string(uVar2);
  iVar1 = strcmp(pcVar3,addr_string1);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,addr_string1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_address.c"
                  ,0x29,"int main(int, const char **)");
  }
  free(pcVar3);
  cmime_address_free(uVar2);
  lVar4 = cmime_address_parse_string(addr_string1);
  pcVar3 = (char *)cmime_address_to_string(lVar4);
  iVar1 = strcmp(pcVar3,addr_string1);
  if (iVar1 == 0) {
    free(pcVar3);
    cmime_address_set_type(lVar4,3);
    if (*(int *)(lVar4 + 0x10) == 3) {
      cmime_address_free(lVar4);
      return 0;
    }
    __assert_fail("cmime_address_get_type(ca) == CMIME_ADDRESS_TYPE_FROM",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_address.c"
                  ,0x34,"int main(int, const char **)");
  }
  __assert_fail("strcmp(s,addr_string1)==0",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_address.c"
                ,0x30,"int main(int, const char **)");
}

Assistant:

int main (int argc, char const *argv[]) {
    char *s = NULL;
    CMimeAddress_T *ca = cmime_address_new();
    
    cmime_address_set_name(ca, addr_string1_name_part);
    cmime_address_set_email(ca, addr_string1_email_part);
    
    s = cmime_address_to_string(ca);
    assert(strcmp(s,addr_string1) == 0);
    free(s);
    cmime_address_free(ca);
    
    ca = cmime_address_parse_string(addr_string1);

    s = cmime_address_to_string(ca);
    assert(strcmp(s,addr_string1)==0);
    free(s);
    
    cmime_address_set_type(ca, CMIME_ADDRESS_TYPE_FROM);
    assert(cmime_address_get_type(ca) == CMIME_ADDRESS_TYPE_FROM);
    
    cmime_address_free(ca);
    return(0);
}